

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestPackage.cpp
# Opt level: O1

int __thiscall deqp::egl::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int iVar1;
  int extraout_EAX;
  EglTestContext *this_00;
  undefined4 extraout_var;
  NativeDisplayFactory *displayFactory;
  TestNode *node;
  TestCaseGroup *pTVar2;
  
  this_00 = (EglTestContext *)operator_new(0x60);
  testCtx = (this->super_TestPackage).super_TestNode.m_testCtx;
  iVar1 = (*testCtx->m_platform->_vptr_Platform[4])();
  displayFactory =
       eglu::selectNativeDisplayFactory
                 ((NativeDisplayFactoryRegistry *)(CONCAT44(extraout_var,iVar1) + 8),
                  testCtx->m_cmdLine);
  EglTestContext::EglTestContext(this_00,testCtx,displayFactory);
  this->m_eglTestCtx = this_00;
  node = (TestNode *)operator_new(0x78);
  InfoTests::InfoTests((InfoTests *)node,this_00);
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,this->m_eglTestCtx,"functional","EGL functional tests");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseGroup_0215e830;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,this->m_eglTestCtx,"performance","EGL performance tests");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseGroup_0215e880;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,this->m_eglTestCtx,"stress","EGL stress tests");
  (pTVar2->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseGroup_0215e8d0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  return extraout_EAX;
}

Assistant:

void TestPackage::init (void)
{
	DE_ASSERT(!m_eglTestCtx);
	m_eglTestCtx = new EglTestContext(m_testCtx, getDefaultDisplayFactory(m_testCtx));

	try
	{
		addChild(new InfoTests			(*m_eglTestCtx));
		addChild(new FunctionalTests	(*m_eglTestCtx));
		addChild(new PerformanceTests	(*m_eglTestCtx));
		addChild(new StressTests		(*m_eglTestCtx));
	}
	catch (...)
	{
		delete m_eglTestCtx;
		m_eglTestCtx = DE_NULL;

		throw;
	}
}